

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  ulong *iLimit;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  uint uVar10;
  U32 *pUVar11;
  U16 *pUVar12;
  seqDef *psVar13;
  int iVar14;
  ushort uVar15;
  undefined8 uVar16;
  uint uVar17;
  ulong uVar18;
  BYTE *pBVar19;
  U32 UVar20;
  uint uVar21;
  ulong *puVar22;
  ulong *puVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  BYTE *pBVar27;
  ulong *puVar28;
  ulong *puVar29;
  U32 UVar30;
  ulong uVar31;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  U32 *hashTable_3;
  BYTE *pBVar35;
  BYTE *pBVar36;
  ulong uVar37;
  BYTE *pBVar38;
  ulong uVar39;
  BYTE *litEnd;
  U32 lowestValid;
  int iVar40;
  uint uVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  U32 hashLog;
  BYTE *litLimit_w;
  ulong local_148;
  char local_140;
  uint local_124;
  char local_120;
  uint auStack_b8 [34];
  char cVar46;
  undefined1 uVar55;
  char cVar56;
  undefined1 uVar57;
  char cVar58;
  undefined1 uVar59;
  char cVar60;
  
  pBVar27 = (ms->window).base;
  uVar26 = (ms->window).dictLimit;
  pBVar35 = pBVar27 + uVar26;
  puVar28 = (ulong *)((ulong)((int)src == (int)pBVar35) + (long)src);
  iVar40 = (int)puVar28 - (int)pBVar27;
  uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar41 = iVar40 - uVar34;
  if (iVar40 - uVar26 <= uVar34) {
    uVar41 = uVar26;
  }
  uVar34 = rep[1];
  if (ms->loadedDictEnd != 0) {
    uVar41 = uVar26;
  }
  uVar41 = iVar40 - uVar41;
  uVar26 = uVar34;
  if (uVar41 < uVar34) {
    uVar26 = 0;
  }
  uVar32 = (ulong)uVar26;
  uVar10 = *rep;
  local_124 = uVar10;
  if (uVar41 < uVar10) {
    local_124 = 0;
  }
  uVar21 = (ms->cParams).minMatch;
  UVar20 = 6;
  if (uVar21 < 6) {
    UVar20 = uVar21;
  }
  puVar5 = (ulong *)((long)src + srcSize);
  iLimit = (ulong *)((long)src + (srcSize - 0x10));
  ZSTD_row_fillHashCache
            (ms,pBVar27,5 - ((ms->cParams).searchLog < 5),UVar20,ms->nextToUpdate,(BYTE *)iLimit);
  if (puVar28 < iLimit) {
    puVar1 = (ulong *)((long)puVar5 - 7);
    puVar2 = (ulong *)((long)puVar5 - 3);
    puVar3 = (ulong *)((long)puVar5 - 1);
    puVar4 = puVar5 + -4;
    do {
      if (local_124 == 0) {
LAB_006c526a:
        uVar26 = (ms->cParams).searchLog;
        uVar21 = (ms->cParams).minMatch;
        if (uVar26 < 5) {
          if (uVar21 - 6 < 2) {
            pUVar11 = ms->hashTable;
            pBVar27 = (ms->window).base;
            uVar24 = (long)puVar28 - (long)pBVar27;
            uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar20 = (ms->window).lowLimit;
            uVar17 = (uint)uVar24;
            UVar30 = uVar17 - uVar21;
            if (uVar17 - UVar20 <= uVar21) {
              UVar30 = UVar20;
            }
            if (ms->loadedDictEnd != 0) {
              UVar30 = UVar20;
            }
            if (3 < uVar26) {
              uVar26 = 4;
            }
            iVar40 = 1 << ((byte)uVar26 & 0x1f);
            pUVar12 = ms->tagTable;
            uVar37 = (ulong)ms->nextToUpdate;
            local_140 = (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar17) {
              do {
                uVar21 = (uint)uVar37 & 7;
                uVar26 = ms->hashCache[uVar21];
                ms->hashCache[uVar21] =
                     (U32)((ulong)(*(long *)(pBVar27 + uVar37 + 8) * -0x30e4432340650000) >>
                          (0x38U - local_140 & 0x3f));
                uVar18 = (ulong)(uVar26 >> 4 & 0xfffffff0);
                uVar21 = (byte)((char)pUVar12[uVar18] - 1) & 0xf;
                *(char *)(pUVar12 + uVar18) = (char)uVar21;
                *(char *)((long)pUVar12 + (ulong)uVar21 + 1 + uVar18 * 2) = (char)uVar26;
                pUVar11[uVar18 + uVar21] = (uint)uVar37;
                uVar37 = uVar37 + 1;
              } while (uVar37 < (uVar24 & 0xffffffff));
            }
            ms->nextToUpdate = uVar17;
            uVar26 = ms->hashCache[uVar17 & 7];
            ms->hashCache[uVar17 & 7] =
                 (U32)((ulong)(*(long *)(pBVar27 + (uVar24 & 0xffffffff) + 8) * -0x30e4432340650000)
                      >> (0x38U - local_140 & 0x3f));
            uVar24 = (ulong)(uVar26 >> 4 & 0xfffffff0);
            bVar9 = (byte)pUVar12[uVar24];
            pcVar7 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
            uVar59 = (undefined1)(uVar26 >> 0x18);
            uVar57 = (undefined1)(uVar26 >> 0x10);
            uVar55 = (undefined1)(uVar26 >> 8);
            auVar48._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar57),CONCAT14(uVar57,uVar26)) >>
                      0x20);
            auVar48[3] = uVar55;
            auVar48[2] = uVar55;
            auVar48[0] = (undefined1)uVar26;
            auVar48[1] = auVar48[0];
            auVar48._8_8_ = 0;
            auVar62 = pshuflw(auVar48,auVar48,0);
            cVar46 = auVar62[0];
            auVar49[0] = -(cVar46 == *pcVar7);
            cVar56 = auVar62[1];
            auVar49[1] = -(cVar56 == pcVar7[1]);
            cVar58 = auVar62[2];
            auVar49[2] = -(cVar58 == pcVar7[2]);
            cVar60 = auVar62[3];
            auVar49[3] = -(cVar60 == pcVar7[3]);
            auVar49[4] = -(cVar46 == pcVar7[4]);
            auVar49[5] = -(cVar56 == pcVar7[5]);
            auVar49[6] = -(cVar58 == pcVar7[6]);
            auVar49[7] = -(cVar60 == pcVar7[7]);
            auVar49[8] = -(cVar46 == pcVar7[8]);
            auVar49[9] = -(cVar56 == pcVar7[9]);
            auVar49[10] = -(cVar58 == pcVar7[10]);
            auVar49[0xb] = -(cVar60 == pcVar7[0xb]);
            auVar49[0xc] = -(cVar46 == pcVar7[0xc]);
            auVar49[0xd] = -(cVar56 == pcVar7[0xd]);
            auVar49[0xe] = -(cVar58 == pcVar7[0xe]);
            auVar49[0xf] = -(cVar60 == pcVar7[0xf]);
            uVar15 = (ushort)(SUB161(auVar49 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar49[0xf] >> 7) << 0xf;
            uVar26 = (uint)uVar15;
            if ((bVar9 & 0xf) != 0) {
              uVar26 = (uint)uVar15 << (0x10 - (bVar9 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar15 >> (bVar9 & 0xf));
            }
            if (uVar26 == 0) {
              uVar37 = 0;
            }
            else {
              uVar37 = 0;
              while( true ) {
                iVar40 = iVar40 + -1;
                iVar14 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
                  }
                }
                if (pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0xf)] < UVar30) break;
                auStack_b8[uVar37] = pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0xf)];
                uVar37 = uVar37 + 1;
                uVar26 = uVar26 & uVar26 - 1;
                if ((uVar26 == 0) || (iVar40 == 0)) break;
              }
            }
            uVar26 = bVar9 - 1 & 0xf;
            *(char *)(pUVar12 + uVar24) = (char)uVar26;
            *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar26 + 1) = auVar48[0];
            UVar20 = ms->nextToUpdate;
            ms->nextToUpdate = UVar20 + 1;
            pUVar11[uVar24 + uVar26] = UVar20;
            if (uVar37 == 0) {
              pBVar36 = (BYTE *)0x3;
              uVar24 = 999999999;
            }
            else {
              uVar24 = 999999999;
              uVar18 = 0;
              pBVar19 = (BYTE *)0x3;
              do {
                puVar23 = (ulong *)(pBVar27 + auStack_b8[uVar18]);
                if (pBVar19[(long)puVar23] == *(BYTE *)((long)puVar28 + (long)pBVar19)) {
                  puVar29 = puVar28;
                  if (puVar28 < puVar1) {
                    uVar39 = *puVar28 ^ *puVar23;
                    uVar31 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
                    if (*puVar23 == *puVar28) {
                      do {
                        puVar29 = puVar29 + 1;
                        puVar23 = puVar23 + 1;
                        if (puVar1 <= puVar29) goto LAB_006c60cc;
                        uVar39 = *puVar29 ^ *puVar23;
                        uVar31 = 0;
                        if (uVar39 != 0) {
                          for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                          }
                        }
                        pBVar38 = (BYTE *)((long)puVar29 +
                                          ((uVar31 >> 3 & 0x1fffffff) - (long)puVar28));
                      } while (*puVar23 == *puVar29);
                    }
                  }
                  else {
LAB_006c60cc:
                    if ((puVar29 < puVar2) && ((int)*puVar23 == (int)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 4);
                      puVar23 = (ulong *)((long)puVar23 + 4);
                    }
                    if ((puVar29 < puVar3) && ((short)*puVar23 == (short)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 2);
                      puVar23 = (ulong *)((long)puVar23 + 2);
                    }
                    if (puVar29 < puVar5) {
                      puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar29))
                      ;
                    }
                    pBVar38 = (BYTE *)((long)puVar29 - (long)puVar28);
                  }
                }
                else {
                  pBVar38 = (BYTE *)0x0;
                }
                pBVar36 = pBVar19;
                if (pBVar19 < pBVar38) {
                  pBVar36 = pBVar38;
                  uVar24 = (ulong)((uVar17 + 2) - auStack_b8[uVar18]);
                }
              } while ((pBVar38 <= pBVar19 || (ulong *)(pBVar38 + (long)puVar28) != puVar5) &&
                      (uVar18 = uVar18 + 1, pBVar19 = pBVar36, uVar18 < uVar37));
            }
          }
          else if (uVar21 == 5) {
            pUVar11 = ms->hashTable;
            pBVar27 = (ms->window).base;
            uVar24 = (long)puVar28 - (long)pBVar27;
            uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar20 = (ms->window).lowLimit;
            uVar17 = (uint)uVar24;
            UVar30 = uVar17 - uVar21;
            if (uVar17 - UVar20 <= uVar21) {
              UVar30 = UVar20;
            }
            if (ms->loadedDictEnd != 0) {
              UVar30 = UVar20;
            }
            if (3 < uVar26) {
              uVar26 = 4;
            }
            iVar40 = 1 << ((byte)uVar26 & 0x1f);
            pUVar12 = ms->tagTable;
            uVar37 = (ulong)ms->nextToUpdate;
            local_120 = (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar17) {
              do {
                uVar21 = (uint)uVar37 & 7;
                uVar26 = ms->hashCache[uVar21];
                ms->hashCache[uVar21] =
                     (U32)((ulong)(*(long *)(pBVar27 + uVar37 + 8) * -0x30e4432345000000) >>
                          (0x38U - local_120 & 0x3f));
                uVar18 = (ulong)(uVar26 >> 4 & 0xfffffff0);
                uVar21 = (byte)((char)pUVar12[uVar18] - 1) & 0xf;
                *(char *)(pUVar12 + uVar18) = (char)uVar21;
                *(char *)((long)pUVar12 + (ulong)uVar21 + 1 + uVar18 * 2) = (char)uVar26;
                pUVar11[uVar18 + uVar21] = (uint)uVar37;
                uVar37 = uVar37 + 1;
              } while (uVar37 < (uVar24 & 0xffffffff));
            }
            ms->nextToUpdate = uVar17;
            uVar26 = ms->hashCache[uVar17 & 7];
            ms->hashCache[uVar17 & 7] =
                 (U32)((ulong)(*(long *)(pBVar27 + (uVar24 & 0xffffffff) + 8) * -0x30e4432345000000)
                      >> (0x38U - local_120 & 0x3f));
            uVar24 = (ulong)(uVar26 >> 4 & 0xfffffff0);
            bVar9 = (byte)pUVar12[uVar24];
            pcVar7 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
            uVar59 = (undefined1)(uVar26 >> 0x18);
            uVar57 = (undefined1)(uVar26 >> 0x10);
            uVar55 = (undefined1)(uVar26 >> 8);
            auVar53._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar57),CONCAT14(uVar57,uVar26)) >>
                      0x20);
            auVar53[3] = uVar55;
            auVar53[2] = uVar55;
            auVar53[0] = (undefined1)uVar26;
            auVar53[1] = auVar53[0];
            auVar53._8_8_ = 0;
            auVar62 = pshuflw(auVar53,auVar53,0);
            cVar46 = auVar62[0];
            auVar51[0] = -(cVar46 == *pcVar7);
            cVar56 = auVar62[1];
            auVar51[1] = -(cVar56 == pcVar7[1]);
            cVar58 = auVar62[2];
            auVar51[2] = -(cVar58 == pcVar7[2]);
            cVar60 = auVar62[3];
            auVar51[3] = -(cVar60 == pcVar7[3]);
            auVar51[4] = -(cVar46 == pcVar7[4]);
            auVar51[5] = -(cVar56 == pcVar7[5]);
            auVar51[6] = -(cVar58 == pcVar7[6]);
            auVar51[7] = -(cVar60 == pcVar7[7]);
            auVar51[8] = -(cVar46 == pcVar7[8]);
            auVar51[9] = -(cVar56 == pcVar7[9]);
            auVar51[10] = -(cVar58 == pcVar7[10]);
            auVar51[0xb] = -(cVar60 == pcVar7[0xb]);
            auVar51[0xc] = -(cVar46 == pcVar7[0xc]);
            auVar51[0xd] = -(cVar56 == pcVar7[0xd]);
            auVar51[0xe] = -(cVar58 == pcVar7[0xe]);
            auVar51[0xf] = -(cVar60 == pcVar7[0xf]);
            uVar15 = (ushort)(SUB161(auVar51 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar51[0xf] >> 7) << 0xf;
            uVar26 = (uint)uVar15;
            if ((bVar9 & 0xf) != 0) {
              uVar26 = (uint)uVar15 << (0x10 - (bVar9 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar15 >> (bVar9 & 0xf));
            }
            if (uVar26 == 0) {
              local_148 = 0;
            }
            else {
              local_148 = 0;
              while( true ) {
                iVar40 = iVar40 + -1;
                iVar14 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
                  }
                }
                if (pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0xf)] < UVar30) break;
                auStack_b8[local_148] = pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0xf)];
                local_148 = local_148 + 1;
                uVar26 = uVar26 & uVar26 - 1;
                if ((uVar26 == 0) || (iVar40 == 0)) break;
              }
            }
            uVar26 = bVar9 - 1 & 0xf;
            *(char *)(pUVar12 + uVar24) = (char)uVar26;
            *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar26 + 1) = auVar53[0];
            UVar20 = ms->nextToUpdate;
            ms->nextToUpdate = UVar20 + 1;
            pUVar11[uVar24 + uVar26] = UVar20;
            if (local_148 == 0) goto LAB_006c66e6;
            uVar24 = 999999999;
            uVar37 = 0;
            pBVar19 = (BYTE *)0x3;
            do {
              puVar23 = (ulong *)(pBVar27 + auStack_b8[uVar37]);
              if (pBVar19[(long)puVar23] == *(BYTE *)((long)puVar28 + (long)pBVar19)) {
                puVar29 = puVar28;
                if (puVar28 < puVar1) {
                  uVar31 = *puVar28 ^ *puVar23;
                  uVar18 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  pBVar38 = (BYTE *)(uVar18 >> 3 & 0x1fffffff);
                  if (*puVar23 == *puVar28) {
                    do {
                      puVar29 = puVar29 + 1;
                      puVar23 = puVar23 + 1;
                      if (puVar1 <= puVar29) goto LAB_006c639d;
                      uVar31 = *puVar29 ^ *puVar23;
                      uVar18 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)((long)puVar29 +
                                        ((uVar18 >> 3 & 0x1fffffff) - (long)puVar28));
                    } while (*puVar23 == *puVar29);
                  }
                }
                else {
LAB_006c639d:
                  if ((puVar29 < puVar2) && ((int)*puVar23 == (int)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar29 < puVar3) && ((short)*puVar23 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar29 < puVar5) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar29));
                  }
                  pBVar38 = (BYTE *)((long)puVar29 - (long)puVar28);
                }
              }
              else {
                pBVar38 = (BYTE *)0x0;
              }
              pBVar36 = pBVar19;
              if (pBVar19 < pBVar38) {
                pBVar36 = pBVar38;
                uVar24 = (ulong)((uVar17 + 2) - auStack_b8[uVar37]);
              }
            } while ((pBVar38 <= pBVar19 || (ulong *)(pBVar38 + (long)puVar28) != puVar5) &&
                    (uVar37 = uVar37 + 1, pBVar19 = pBVar36, uVar37 < local_148));
          }
          else {
            pUVar11 = ms->hashTable;
            pBVar27 = (ms->window).base;
            uVar24 = (long)puVar28 - (long)pBVar27;
            uVar21 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar20 = (ms->window).lowLimit;
            uVar17 = (uint)uVar24;
            UVar30 = uVar17 - uVar21;
            if (uVar17 - UVar20 <= uVar21) {
              UVar30 = UVar20;
            }
            if (ms->loadedDictEnd != 0) {
              UVar30 = UVar20;
            }
            if (3 < uVar26) {
              uVar26 = 4;
            }
            iVar40 = 1 << ((byte)uVar26 & 0x1f);
            pUVar12 = ms->tagTable;
            uVar37 = (ulong)ms->nextToUpdate;
            local_148._0_1_ = (char)ms->rowHashLog;
            if (ms->nextToUpdate < uVar17) {
              do {
                uVar21 = (uint)uVar37 & 7;
                uVar26 = ms->hashCache[uVar21];
                ms->hashCache[uVar21] =
                     (uint)(*(int *)(pBVar27 + uVar37 + 8) * -0x61c8864f) >>
                     (0x18U - (char)local_148 & 0x1f);
                uVar18 = (ulong)(uVar26 >> 4 & 0xfffffff0);
                uVar21 = (byte)((char)pUVar12[uVar18] - 1) & 0xf;
                *(char *)(pUVar12 + uVar18) = (char)uVar21;
                *(char *)((long)pUVar12 + (ulong)uVar21 + 1 + uVar18 * 2) = (char)uVar26;
                pUVar11[uVar18 + uVar21] = (uint)uVar37;
                uVar37 = uVar37 + 1;
              } while (uVar37 < (uVar24 & 0xffffffff));
            }
            ms->nextToUpdate = uVar17;
            uVar26 = ms->hashCache[uVar17 & 7];
            ms->hashCache[uVar17 & 7] =
                 (uint)(*(int *)(pBVar27 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
                 (0x18U - (char)local_148 & 0x1f);
            uVar24 = (ulong)(uVar26 >> 4 & 0xfffffff0);
            bVar9 = (byte)pUVar12[uVar24];
            pcVar7 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
            uVar59 = (undefined1)(uVar26 >> 0x18);
            uVar57 = (undefined1)(uVar26 >> 0x10);
            uVar55 = (undefined1)(uVar26 >> 8);
            auVar62._4_4_ =
                 (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar57),CONCAT14(uVar57,uVar26)) >>
                      0x20);
            auVar62[3] = uVar55;
            auVar62[2] = uVar55;
            auVar62[0] = (undefined1)uVar26;
            auVar62[1] = auVar62[0];
            auVar62._8_8_ = 0;
            auVar53 = pshuflw(auVar62,auVar62,0);
            cVar46 = auVar53[0];
            auVar54[0] = -(cVar46 == *pcVar7);
            cVar56 = auVar53[1];
            auVar54[1] = -(cVar56 == pcVar7[1]);
            cVar58 = auVar53[2];
            auVar54[2] = -(cVar58 == pcVar7[2]);
            cVar60 = auVar53[3];
            auVar54[3] = -(cVar60 == pcVar7[3]);
            auVar54[4] = -(cVar46 == pcVar7[4]);
            auVar54[5] = -(cVar56 == pcVar7[5]);
            auVar54[6] = -(cVar58 == pcVar7[6]);
            auVar54[7] = -(cVar60 == pcVar7[7]);
            auVar54[8] = -(cVar46 == pcVar7[8]);
            auVar54[9] = -(cVar56 == pcVar7[9]);
            auVar54[10] = -(cVar58 == pcVar7[10]);
            auVar54[0xb] = -(cVar60 == pcVar7[0xb]);
            auVar54[0xc] = -(cVar46 == pcVar7[0xc]);
            auVar54[0xd] = -(cVar56 == pcVar7[0xd]);
            auVar54[0xe] = -(cVar58 == pcVar7[0xe]);
            auVar54[0xf] = -(cVar60 == pcVar7[0xf]);
            uVar15 = (ushort)(SUB161(auVar54 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar54[0xf] >> 7) << 0xf;
            uVar26 = (uint)uVar15;
            if ((bVar9 & 0xf) != 0) {
              uVar26 = (uint)uVar15 << (0x10 - (bVar9 & 0xf) & 0x1f) & 0xfffe |
                       (uint)(uVar15 >> (bVar9 & 0xf));
            }
            if (uVar26 == 0) {
              local_148 = 0;
            }
            else {
              local_148 = 0;
              while( true ) {
                iVar40 = iVar40 + -1;
                iVar14 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
                  }
                }
                if (pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0xf)] < UVar30) break;
                auStack_b8[local_148] = pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0xf)];
                local_148 = local_148 + 1;
                uVar26 = uVar26 & uVar26 - 1;
                if ((uVar26 == 0) || (iVar40 == 0)) break;
              }
            }
            uVar26 = bVar9 - 1 & 0xf;
            *(char *)(pUVar12 + uVar24) = (char)uVar26;
            *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar26 + 1) = auVar62[0];
            UVar20 = ms->nextToUpdate;
            ms->nextToUpdate = UVar20 + 1;
            pUVar11[uVar24 + uVar26] = UVar20;
            if (local_148 == 0) goto LAB_006c66e6;
            uVar24 = 999999999;
            uVar37 = 0;
            pBVar19 = (BYTE *)0x3;
            do {
              puVar23 = (ulong *)(pBVar27 + auStack_b8[uVar37]);
              if (pBVar19[(long)puVar23] == *(BYTE *)((long)puVar28 + (long)pBVar19)) {
                puVar29 = puVar28;
                if (puVar28 < puVar1) {
                  uVar31 = *puVar28 ^ *puVar23;
                  uVar18 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  pBVar38 = (BYTE *)(uVar18 >> 3 & 0x1fffffff);
                  if (*puVar23 == *puVar28) {
                    do {
                      puVar29 = puVar29 + 1;
                      puVar23 = puVar23 + 1;
                      if (puVar1 <= puVar29) goto LAB_006c665c;
                      uVar31 = *puVar29 ^ *puVar23;
                      uVar18 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)((long)puVar29 +
                                        ((uVar18 >> 3 & 0x1fffffff) - (long)puVar28));
                    } while (*puVar23 == *puVar29);
                  }
                }
                else {
LAB_006c665c:
                  if ((puVar29 < puVar2) && ((int)*puVar23 == (int)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar29 < puVar3) && ((short)*puVar23 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar29 < puVar5) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar29));
                  }
                  pBVar38 = (BYTE *)((long)puVar29 - (long)puVar28);
                }
              }
              else {
                pBVar38 = (BYTE *)0x0;
              }
              pBVar36 = pBVar19;
              if (pBVar19 < pBVar38) {
                pBVar36 = pBVar38;
                uVar24 = (ulong)((uVar17 + 2) - auStack_b8[uVar37]);
              }
            } while ((pBVar38 <= pBVar19 || (ulong *)(pBVar38 + (long)puVar28) != puVar5) &&
                    (uVar37 = uVar37 + 1, pBVar19 = pBVar36, uVar37 < local_148));
          }
        }
        else if (uVar21 - 6 < 2) {
          pUVar11 = ms->hashTable;
          pBVar27 = (ms->window).base;
          uVar24 = (long)puVar28 - (long)pBVar27;
          uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar26 = (ms->window).lowLimit;
          uVar25 = (uint)uVar24;
          uVar21 = uVar25 - uVar17;
          if (uVar25 - uVar26 <= uVar17) {
            uVar21 = uVar26;
          }
          pUVar12 = ms->tagTable;
          if (ms->loadedDictEnd != 0) {
            uVar21 = uVar26;
          }
          uVar37 = (ulong)ms->nextToUpdate;
          local_140 = (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar25) {
            do {
              uVar17 = (uint)uVar37 & 7;
              uVar26 = ms->hashCache[uVar17];
              ms->hashCache[uVar17] =
                   (U32)((ulong)(*(long *)(pBVar27 + uVar37 + 8) * -0x30e4432340650000) >>
                        (0x38U - local_140 & 0x3f));
              uVar18 = (ulong)(uVar26 >> 3 & 0xffffffe0);
              uVar17 = (byte)((char)pUVar12[uVar18] - 1) & 0x1f;
              *(char *)(pUVar12 + uVar18) = (char)uVar17;
              *(char *)((long)pUVar12 + (ulong)uVar17 + 1 + uVar18 * 2) = (char)uVar26;
              pUVar11[uVar18 + uVar17] = (uint)uVar37;
              uVar37 = uVar37 + 1;
            } while (uVar37 < (uVar24 & 0xffffffff));
          }
          ms->nextToUpdate = uVar25;
          uVar26 = ms->hashCache[uVar25 & 7];
          ms->hashCache[uVar25 & 7] =
               (U32)((ulong)(*(long *)(pBVar27 + (uVar24 & 0xffffffff) + 8) * -0x30e4432340650000)
                    >> (0x38U - local_140 & 0x3f));
          uVar24 = (ulong)(uVar26 >> 3 & 0xffffffe0);
          bVar9 = (byte)pUVar12[uVar24];
          pcVar7 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
          pcVar8 = (char *)((long)pUVar12 + uVar24 * 2 + 0x11);
          uVar59 = (undefined1)(uVar26 >> 0x18);
          uVar57 = (undefined1)(uVar26 >> 0x10);
          uVar55 = (undefined1)(uVar26 >> 8);
          auVar61._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar57),CONCAT14(uVar57,uVar26)) >>
                    0x20);
          auVar61[3] = uVar55;
          auVar61[2] = uVar55;
          auVar61[0] = (undefined1)uVar26;
          auVar61[1] = auVar61[0];
          auVar61._8_8_ = 0;
          auVar62 = pshuflw(auVar61,auVar61,0);
          cVar46 = auVar62[0];
          auVar43[0] = -(*pcVar7 == cVar46);
          cVar56 = auVar62[1];
          auVar43[1] = -(pcVar7[1] == cVar56);
          cVar58 = auVar62[2];
          auVar43[2] = -(pcVar7[2] == cVar58);
          cVar60 = auVar62[3];
          auVar43[3] = -(pcVar7[3] == cVar60);
          auVar43[4] = -(pcVar7[4] == cVar46);
          auVar43[5] = -(pcVar7[5] == cVar56);
          auVar43[6] = -(pcVar7[6] == cVar58);
          auVar43[7] = -(pcVar7[7] == cVar60);
          auVar43[8] = -(pcVar7[8] == cVar46);
          auVar43[9] = -(pcVar7[9] == cVar56);
          auVar43[10] = -(pcVar7[10] == cVar58);
          auVar43[0xb] = -(pcVar7[0xb] == cVar60);
          auVar43[0xc] = -(pcVar7[0xc] == cVar46);
          auVar43[0xd] = -(pcVar7[0xd] == cVar56);
          auVar43[0xe] = -(pcVar7[0xe] == cVar58);
          auVar43[0xf] = -(pcVar7[0xf] == cVar60);
          auVar47[0] = -(*pcVar8 == cVar46);
          auVar47[1] = -(pcVar8[1] == cVar56);
          auVar47[2] = -(pcVar8[2] == cVar58);
          auVar47[3] = -(pcVar8[3] == cVar60);
          auVar47[4] = -(pcVar8[4] == cVar46);
          auVar47[5] = -(pcVar8[5] == cVar56);
          auVar47[6] = -(pcVar8[6] == cVar58);
          auVar47[7] = -(pcVar8[7] == cVar60);
          auVar47[8] = -(pcVar8[8] == cVar46);
          auVar47[9] = -(pcVar8[9] == cVar56);
          auVar47[10] = -(pcVar8[10] == cVar58);
          auVar47[0xb] = -(pcVar8[0xb] == cVar60);
          auVar47[0xc] = -(pcVar8[0xc] == cVar46);
          auVar47[0xd] = -(pcVar8[0xd] == cVar56);
          auVar47[0xe] = -(pcVar8[0xe] == cVar58);
          auVar47[0xf] = -(pcVar8[0xf] == cVar60);
          uVar17 = CONCAT22((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar47[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar43 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar43[0xf] >> 7) << 0xf);
          uVar26 = uVar17 >> (bVar9 & 0x1f) | uVar17 << 0x20 - (bVar9 & 0x1f);
          if ((bVar9 & 0x1f) == 0) {
            uVar26 = uVar17;
          }
          if (uVar26 == 0) {
            uVar37 = 0;
          }
          else {
            uVar37 = 0;
            iVar40 = -0x1f;
            while( true ) {
              iVar14 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
                }
              }
              if (pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0x1f)] < uVar21) break;
              auStack_b8[uVar37] = pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0x1f)];
              uVar37 = uVar37 + 1;
              uVar26 = uVar26 & uVar26 - 1;
              if ((uVar26 == 0) || (bVar42 = iVar40 == 0, iVar40 = iVar40 + 1, bVar42)) break;
            }
          }
          uVar26 = bVar9 - 1 & 0x1f;
          *(char *)(pUVar12 + uVar24) = (char)uVar26;
          *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar26 + 1) = auVar61[0];
          UVar20 = ms->nextToUpdate;
          ms->nextToUpdate = UVar20 + 1;
          pUVar11[uVar24 + uVar26] = UVar20;
          if (uVar37 == 0) goto LAB_006c66e6;
          uVar24 = 999999999;
          uVar18 = 0;
          pBVar19 = (BYTE *)0x3;
          do {
            puVar23 = (ulong *)(pBVar27 + auStack_b8[uVar18]);
            if (pBVar19[(long)puVar23] == *(BYTE *)((long)puVar28 + (long)pBVar19)) {
              puVar29 = puVar28;
              if (puVar28 < puVar1) {
                uVar39 = *puVar28 ^ *puVar23;
                uVar31 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                pBVar38 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
                if (*puVar23 == *puVar28) {
                  do {
                    puVar29 = puVar29 + 1;
                    puVar23 = puVar23 + 1;
                    if (puVar1 <= puVar29) goto LAB_006c5f6a;
                    uVar39 = *puVar29 ^ *puVar23;
                    uVar31 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)((long)puVar29 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar28))
                    ;
                  } while (*puVar23 == *puVar29);
                }
              }
              else {
LAB_006c5f6a:
                if ((puVar29 < puVar2) && ((int)*puVar23 == (int)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar29 < puVar3) && ((short)*puVar23 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar29 < puVar5) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar29));
                }
                pBVar38 = (BYTE *)((long)puVar29 - (long)puVar28);
              }
            }
            else {
              pBVar38 = (BYTE *)0x0;
            }
            pBVar36 = pBVar19;
            if (pBVar19 < pBVar38) {
              pBVar36 = pBVar38;
              uVar24 = (ulong)((uVar25 + 2) - auStack_b8[uVar18]);
            }
          } while ((pBVar38 <= pBVar19 || (ulong *)(pBVar38 + (long)puVar28) != puVar5) &&
                  (uVar18 = uVar18 + 1, pBVar19 = pBVar36, uVar18 < uVar37));
        }
        else if (uVar21 == 5) {
          pUVar11 = ms->hashTable;
          pBVar27 = (ms->window).base;
          uVar24 = (long)puVar28 - (long)pBVar27;
          uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar26 = (ms->window).lowLimit;
          uVar25 = (uint)uVar24;
          uVar21 = uVar25 - uVar17;
          if (uVar25 - uVar26 <= uVar17) {
            uVar21 = uVar26;
          }
          pUVar12 = ms->tagTable;
          if (ms->loadedDictEnd != 0) {
            uVar21 = uVar26;
          }
          uVar37 = (ulong)ms->nextToUpdate;
          local_140 = (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar25) {
            do {
              uVar17 = (uint)uVar37 & 7;
              uVar26 = ms->hashCache[uVar17];
              ms->hashCache[uVar17] =
                   (U32)((ulong)(*(long *)(pBVar27 + uVar37 + 8) * -0x30e4432345000000) >>
                        (0x38U - local_140 & 0x3f));
              uVar18 = (ulong)(uVar26 >> 3 & 0xffffffe0);
              uVar17 = (byte)((char)pUVar12[uVar18] - 1) & 0x1f;
              *(char *)(pUVar12 + uVar18) = (char)uVar17;
              *(char *)((long)pUVar12 + (ulong)uVar17 + 1 + uVar18 * 2) = (char)uVar26;
              pUVar11[uVar18 + uVar17] = (uint)uVar37;
              uVar37 = uVar37 + 1;
            } while (uVar37 < (uVar24 & 0xffffffff));
          }
          ms->nextToUpdate = uVar25;
          uVar26 = ms->hashCache[uVar25 & 7];
          ms->hashCache[uVar25 & 7] =
               (U32)((ulong)(*(long *)(pBVar27 + (uVar24 & 0xffffffff) + 8) * -0x30e4432345000000)
                    >> (0x38U - local_140 & 0x3f));
          uVar24 = (ulong)(uVar26 >> 3 & 0xffffffe0);
          bVar9 = (byte)pUVar12[uVar24];
          pcVar7 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
          pcVar8 = (char *)((long)pUVar12 + uVar24 * 2 + 0x11);
          uVar59 = (undefined1)(uVar26 >> 0x18);
          uVar57 = (undefined1)(uVar26 >> 0x10);
          uVar55 = (undefined1)(uVar26 >> 8);
          auVar63._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar57),CONCAT14(uVar57,uVar26)) >>
                    0x20);
          auVar63[3] = uVar55;
          auVar63[2] = uVar55;
          auVar63[0] = (undefined1)uVar26;
          auVar63[1] = auVar63[0];
          auVar63._8_8_ = 0;
          auVar62 = pshuflw(auVar63,auVar63,0);
          cVar46 = auVar62[0];
          auVar44[0] = -(*pcVar7 == cVar46);
          cVar56 = auVar62[1];
          auVar44[1] = -(pcVar7[1] == cVar56);
          cVar58 = auVar62[2];
          auVar44[2] = -(pcVar7[2] == cVar58);
          cVar60 = auVar62[3];
          auVar44[3] = -(pcVar7[3] == cVar60);
          auVar44[4] = -(pcVar7[4] == cVar46);
          auVar44[5] = -(pcVar7[5] == cVar56);
          auVar44[6] = -(pcVar7[6] == cVar58);
          auVar44[7] = -(pcVar7[7] == cVar60);
          auVar44[8] = -(pcVar7[8] == cVar46);
          auVar44[9] = -(pcVar7[9] == cVar56);
          auVar44[10] = -(pcVar7[10] == cVar58);
          auVar44[0xb] = -(pcVar7[0xb] == cVar60);
          auVar44[0xc] = -(pcVar7[0xc] == cVar46);
          auVar44[0xd] = -(pcVar7[0xd] == cVar56);
          auVar44[0xe] = -(pcVar7[0xe] == cVar58);
          auVar44[0xf] = -(pcVar7[0xf] == cVar60);
          auVar50[0] = -(*pcVar8 == cVar46);
          auVar50[1] = -(pcVar8[1] == cVar56);
          auVar50[2] = -(pcVar8[2] == cVar58);
          auVar50[3] = -(pcVar8[3] == cVar60);
          auVar50[4] = -(pcVar8[4] == cVar46);
          auVar50[5] = -(pcVar8[5] == cVar56);
          auVar50[6] = -(pcVar8[6] == cVar58);
          auVar50[7] = -(pcVar8[7] == cVar60);
          auVar50[8] = -(pcVar8[8] == cVar46);
          auVar50[9] = -(pcVar8[9] == cVar56);
          auVar50[10] = -(pcVar8[10] == cVar58);
          auVar50[0xb] = -(pcVar8[0xb] == cVar60);
          auVar50[0xc] = -(pcVar8[0xc] == cVar46);
          auVar50[0xd] = -(pcVar8[0xd] == cVar56);
          auVar50[0xe] = -(pcVar8[0xe] == cVar58);
          auVar50[0xf] = -(pcVar8[0xf] == cVar60);
          uVar17 = CONCAT22((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar50[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar44 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar44[0xf] >> 7) << 0xf);
          uVar26 = uVar17 >> (bVar9 & 0x1f) | uVar17 << 0x20 - (bVar9 & 0x1f);
          if ((bVar9 & 0x1f) == 0) {
            uVar26 = uVar17;
          }
          if (uVar26 == 0) {
            uVar37 = 0;
          }
          else {
            uVar37 = 0;
            iVar40 = -0x1f;
            while( true ) {
              iVar14 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
                }
              }
              if (pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0x1f)] < uVar21) break;
              auStack_b8[uVar37] = pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0x1f)];
              uVar37 = uVar37 + 1;
              uVar26 = uVar26 & uVar26 - 1;
              if ((uVar26 == 0) || (bVar42 = iVar40 == 0, iVar40 = iVar40 + 1, bVar42)) break;
            }
          }
          uVar26 = bVar9 - 1 & 0x1f;
          *(char *)(pUVar12 + uVar24) = (char)uVar26;
          *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar26 + 1) = auVar63[0];
          UVar20 = ms->nextToUpdate;
          ms->nextToUpdate = UVar20 + 1;
          pUVar11[uVar24 + uVar26] = UVar20;
          if (uVar37 == 0) {
LAB_006c66e6:
            pBVar36 = (BYTE *)0x3;
            uVar24 = 999999999;
          }
          else {
            uVar24 = 999999999;
            uVar18 = 0;
            pBVar19 = (BYTE *)0x3;
            do {
              puVar23 = (ulong *)(pBVar27 + auStack_b8[uVar18]);
              if (pBVar19[(long)puVar23] == *(BYTE *)((long)puVar28 + (long)pBVar19)) {
                puVar29 = puVar28;
                if (puVar28 < puVar1) {
                  uVar39 = *puVar28 ^ *puVar23;
                  uVar31 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  pBVar38 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
                  if (*puVar23 == *puVar28) {
                    do {
                      puVar29 = puVar29 + 1;
                      puVar23 = puVar23 + 1;
                      if (puVar1 <= puVar29) goto LAB_006c623e;
                      uVar39 = *puVar29 ^ *puVar23;
                      uVar31 = 0;
                      if (uVar39 != 0) {
                        for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      pBVar38 = (BYTE *)((long)puVar29 +
                                        ((uVar31 >> 3 & 0x1fffffff) - (long)puVar28));
                    } while (*puVar23 == *puVar29);
                  }
                }
                else {
LAB_006c623e:
                  if ((puVar29 < puVar2) && ((int)*puVar23 == (int)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar23 = (ulong *)((long)puVar23 + 4);
                  }
                  if ((puVar29 < puVar3) && ((short)*puVar23 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar23 = (ulong *)((long)puVar23 + 2);
                  }
                  if (puVar29 < puVar5) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar29));
                  }
                  pBVar38 = (BYTE *)((long)puVar29 - (long)puVar28);
                }
              }
              else {
                pBVar38 = (BYTE *)0x0;
              }
              pBVar36 = pBVar19;
              if (pBVar19 < pBVar38) {
                pBVar36 = pBVar38;
                uVar24 = (ulong)((uVar25 + 2) - auStack_b8[uVar18]);
              }
            } while ((pBVar38 <= pBVar19 || (ulong *)(pBVar38 + (long)puVar28) != puVar5) &&
                    (uVar18 = uVar18 + 1, pBVar19 = pBVar36, uVar18 < uVar37));
          }
        }
        else {
          pUVar11 = ms->hashTable;
          pBVar27 = (ms->window).base;
          uVar24 = (long)puVar28 - (long)pBVar27;
          uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar26 = (ms->window).lowLimit;
          uVar25 = (uint)uVar24;
          uVar21 = uVar25 - uVar17;
          if (uVar25 - uVar26 <= uVar17) {
            uVar21 = uVar26;
          }
          pUVar12 = ms->tagTable;
          if (ms->loadedDictEnd != 0) {
            uVar21 = uVar26;
          }
          uVar37 = (ulong)ms->nextToUpdate;
          local_140 = (char)ms->rowHashLog;
          if (ms->nextToUpdate < uVar25) {
            do {
              uVar17 = (uint)uVar37 & 7;
              uVar26 = ms->hashCache[uVar17];
              ms->hashCache[uVar17] =
                   (uint)(*(int *)(pBVar27 + uVar37 + 8) * -0x61c8864f) >>
                   (0x18U - local_140 & 0x1f);
              uVar18 = (ulong)(uVar26 >> 3 & 0xffffffe0);
              uVar17 = (byte)((char)pUVar12[uVar18] - 1) & 0x1f;
              *(char *)(pUVar12 + uVar18) = (char)uVar17;
              *(char *)((long)pUVar12 + (ulong)uVar17 + 1 + uVar18 * 2) = (char)uVar26;
              pUVar11[uVar18 + uVar17] = (uint)uVar37;
              uVar37 = uVar37 + 1;
            } while (uVar37 < (uVar24 & 0xffffffff));
          }
          ms->nextToUpdate = uVar25;
          uVar26 = ms->hashCache[uVar25 & 7];
          ms->hashCache[uVar25 & 7] =
               (uint)(*(int *)(pBVar27 + (uVar24 & 0xffffffff) + 8) * -0x61c8864f) >>
               (0x18U - local_140 & 0x1f);
          uVar24 = (ulong)(uVar26 >> 3 & 0xffffffe0);
          bVar9 = (byte)pUVar12[uVar24];
          pcVar7 = (char *)((long)pUVar12 + uVar24 * 2 + 1);
          pcVar8 = (char *)((long)pUVar12 + uVar24 * 2 + 0x11);
          uVar59 = (undefined1)(uVar26 >> 0x18);
          uVar57 = (undefined1)(uVar26 >> 0x10);
          uVar55 = (undefined1)(uVar26 >> 8);
          auVar64._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar57),CONCAT14(uVar57,uVar26)) >>
                    0x20);
          auVar64[3] = uVar55;
          auVar64[2] = uVar55;
          auVar64[0] = (undefined1)uVar26;
          auVar64[1] = auVar64[0];
          auVar64._8_8_ = 0;
          auVar62 = pshuflw(auVar64,auVar64,0);
          cVar46 = auVar62[0];
          auVar45[0] = -(*pcVar7 == cVar46);
          cVar56 = auVar62[1];
          auVar45[1] = -(pcVar7[1] == cVar56);
          cVar58 = auVar62[2];
          auVar45[2] = -(pcVar7[2] == cVar58);
          cVar60 = auVar62[3];
          auVar45[3] = -(pcVar7[3] == cVar60);
          auVar45[4] = -(pcVar7[4] == cVar46);
          auVar45[5] = -(pcVar7[5] == cVar56);
          auVar45[6] = -(pcVar7[6] == cVar58);
          auVar45[7] = -(pcVar7[7] == cVar60);
          auVar45[8] = -(pcVar7[8] == cVar46);
          auVar45[9] = -(pcVar7[9] == cVar56);
          auVar45[10] = -(pcVar7[10] == cVar58);
          auVar45[0xb] = -(pcVar7[0xb] == cVar60);
          auVar45[0xc] = -(pcVar7[0xc] == cVar46);
          auVar45[0xd] = -(pcVar7[0xd] == cVar56);
          auVar45[0xe] = -(pcVar7[0xe] == cVar58);
          auVar45[0xf] = -(pcVar7[0xf] == cVar60);
          auVar52[0] = -(*pcVar8 == cVar46);
          auVar52[1] = -(pcVar8[1] == cVar56);
          auVar52[2] = -(pcVar8[2] == cVar58);
          auVar52[3] = -(pcVar8[3] == cVar60);
          auVar52[4] = -(pcVar8[4] == cVar46);
          auVar52[5] = -(pcVar8[5] == cVar56);
          auVar52[6] = -(pcVar8[6] == cVar58);
          auVar52[7] = -(pcVar8[7] == cVar60);
          auVar52[8] = -(pcVar8[8] == cVar46);
          auVar52[9] = -(pcVar8[9] == cVar56);
          auVar52[10] = -(pcVar8[10] == cVar58);
          auVar52[0xb] = -(pcVar8[0xb] == cVar60);
          auVar52[0xc] = -(pcVar8[0xc] == cVar46);
          auVar52[0xd] = -(pcVar8[0xd] == cVar56);
          auVar52[0xe] = -(pcVar8[0xe] == cVar58);
          auVar52[0xf] = -(pcVar8[0xf] == cVar60);
          uVar17 = CONCAT22((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar52[0xf] >> 7) << 0xf,
                            (ushort)(SUB161(auVar45 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar45[0xf] >> 7) << 0xf);
          uVar26 = uVar17 >> (bVar9 & 0x1f) | uVar17 << 0x20 - (bVar9 & 0x1f);
          if ((bVar9 & 0x1f) == 0) {
            uVar26 = uVar17;
          }
          if (uVar26 == 0) {
            uVar37 = 0;
          }
          else {
            uVar37 = 0;
            iVar40 = -0x1f;
            while( true ) {
              iVar14 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> iVar14 & 1) == 0; iVar14 = iVar14 + 1) {
                }
              }
              if (pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0x1f)] < uVar21) break;
              auStack_b8[uVar37] = pUVar11[uVar24 + (iVar14 + (uint)bVar9 & 0x1f)];
              uVar37 = uVar37 + 1;
              uVar26 = uVar26 & uVar26 - 1;
              if ((uVar26 == 0) || (bVar42 = iVar40 == 0, iVar40 = iVar40 + 1, bVar42)) break;
            }
          }
          uVar26 = bVar9 - 1 & 0x1f;
          *(char *)(pUVar12 + uVar24) = (char)uVar26;
          *(undefined1 *)((long)(pUVar12 + uVar24) + (ulong)uVar26 + 1) = auVar64[0];
          UVar20 = ms->nextToUpdate;
          ms->nextToUpdate = UVar20 + 1;
          pUVar11[uVar24 + uVar26] = UVar20;
          if (uVar37 == 0) goto LAB_006c66e6;
          uVar24 = 999999999;
          uVar18 = 0;
          pBVar19 = (BYTE *)0x3;
          do {
            puVar23 = (ulong *)(pBVar27 + auStack_b8[uVar18]);
            if (pBVar19[(long)puVar23] == *(BYTE *)((long)puVar28 + (long)pBVar19)) {
              puVar29 = puVar28;
              if (puVar28 < puVar1) {
                uVar39 = *puVar28 ^ *puVar23;
                uVar31 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                pBVar38 = (BYTE *)(uVar31 >> 3 & 0x1fffffff);
                if (*puVar23 == *puVar28) {
                  do {
                    puVar29 = puVar29 + 1;
                    puVar23 = puVar23 + 1;
                    if (puVar1 <= puVar29) goto LAB_006c64fd;
                    uVar39 = *puVar29 ^ *puVar23;
                    uVar31 = 0;
                    if (uVar39 != 0) {
                      for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)((long)puVar29 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar28))
                    ;
                  } while (*puVar23 == *puVar29);
                }
              }
              else {
LAB_006c64fd:
                if ((puVar29 < puVar2) && ((int)*puVar23 == (int)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar23 = (ulong *)((long)puVar23 + 4);
                }
                if ((puVar29 < puVar3) && ((short)*puVar23 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar23 = (ulong *)((long)puVar23 + 2);
                }
                if (puVar29 < puVar5) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar29));
                }
                pBVar38 = (BYTE *)((long)puVar29 - (long)puVar28);
              }
            }
            else {
              pBVar38 = (BYTE *)0x0;
            }
            pBVar36 = pBVar19;
            if (pBVar19 < pBVar38) {
              pBVar36 = pBVar38;
              uVar24 = (ulong)((uVar25 + 2) - auStack_b8[uVar18]);
            }
          } while ((pBVar38 <= pBVar19 || (ulong *)(pBVar38 + (long)puVar28) != puVar5) &&
                  (uVar18 = uVar18 + 1, pBVar19 = pBVar36, uVar18 < uVar37));
        }
        if ((BYTE *)0x3 < pBVar36) {
          if (uVar24 == 0) goto LAB_006c5ae1;
          if ((src < puVar28) && (pBVar35 < (BYTE *)((long)puVar28 + (2 - uVar24)))) {
            puVar23 = puVar28;
            while (puVar28 = puVar23,
                  *(BYTE *)((long)puVar23 - 1) == *(BYTE *)((long)puVar23 + (1 - uVar24))) {
              puVar28 = (ulong *)((long)puVar23 - 1);
              pBVar36 = pBVar36 + 1;
              if ((puVar28 <= src) ||
                 (pBVar27 = (BYTE *)((long)puVar23 + (1 - uVar24)), puVar23 = puVar28,
                 pBVar27 <= pBVar35)) break;
            }
          }
          uVar32 = (ulong)local_124;
          local_124 = (int)uVar24 - 2;
          UVar20 = (int)uVar24 + 1;
          goto LAB_006c6784;
        }
        puVar28 = (ulong *)((long)puVar28 + ((long)puVar28 - (long)src >> 8) + 1);
      }
      else {
        uVar24 = (ulong)local_124;
        if (*(int *)(((long)puVar28 + 1) - uVar24) != *(int *)((long)puVar28 + 1))
        goto LAB_006c526a;
        puVar23 = (ulong *)((long)puVar28 + 5);
        puVar22 = (ulong *)((long)puVar28 + (5 - uVar24));
        puVar29 = puVar23;
        if (puVar23 < puVar1) {
          uVar18 = *puVar23 ^ *puVar22;
          uVar37 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
            }
          }
          pBVar36 = (BYTE *)(uVar37 >> 3 & 0x1fffffff);
          if (*puVar22 == *puVar23) {
            puVar29 = (ulong *)((long)puVar28 + 0xd);
            puVar22 = (ulong *)((long)puVar28 + (0xd - uVar24));
            do {
              if (puVar1 <= puVar29) goto LAB_006c568e;
              uVar24 = *puVar22;
              uVar37 = *puVar29;
              uVar31 = uVar37 ^ uVar24;
              uVar18 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              pBVar36 = (BYTE *)((long)puVar29 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar23));
              puVar29 = puVar29 + 1;
              puVar22 = puVar22 + 1;
            } while (uVar24 == uVar37);
          }
        }
        else {
LAB_006c568e:
          if ((puVar29 < puVar2) && ((int)*puVar22 == (int)*puVar29)) {
            puVar29 = (ulong *)((long)puVar29 + 4);
            puVar22 = (ulong *)((long)puVar22 + 4);
          }
          if ((puVar29 < puVar3) && ((short)*puVar22 == (short)*puVar29)) {
            puVar29 = (ulong *)((long)puVar29 + 2);
            puVar22 = (ulong *)((long)puVar22 + 2);
          }
          if (puVar29 < puVar5) {
            puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar29));
          }
          pBVar36 = (BYTE *)((long)puVar29 - (long)puVar23);
        }
        pBVar36 = pBVar36 + 4;
        puVar28 = (ulong *)((long)puVar28 + 1);
LAB_006c5ae1:
        UVar20 = 1;
LAB_006c6784:
        uVar24 = (long)puVar28 - (long)src;
        if (puVar4 < puVar28) {
          puVar29 = (ulong *)seqStore->lit;
          puVar23 = puVar29;
          puVar22 = (ulong *)src;
          if (src <= puVar4) {
            puVar23 = (ulong *)((long)puVar29 + ((long)puVar4 - (long)src));
            uVar37 = *(ulong *)((long)src + 8);
            *puVar29 = *src;
            puVar29[1] = uVar37;
            puVar22 = puVar4;
            if (0x10 < (long)puVar4 - (long)src) {
              lVar33 = 0x10;
              do {
                uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar33) + 8);
                puVar6 = (undefined8 *)((long)puVar29 + lVar33);
                *puVar6 = *(undefined8 *)((long)src + lVar33);
                puVar6[1] = uVar16;
                pBVar27 = (BYTE *)((long)src + lVar33 + 0x10);
                uVar16 = *(undefined8 *)(pBVar27 + 8);
                puVar6[2] = *(undefined8 *)pBVar27;
                puVar6[3] = uVar16;
                lVar33 = lVar33 + 0x20;
              } while (puVar6 + 4 < puVar23);
            }
          }
          if (puVar22 < puVar28) {
            lVar33 = 0;
            do {
              *(BYTE *)((long)puVar23 + lVar33) = *(BYTE *)((long)puVar22 + lVar33);
              lVar33 = lVar33 + 1;
            } while ((long)puVar28 - (long)puVar22 != lVar33);
          }
        }
        else {
          puVar23 = (ulong *)seqStore->lit;
          uVar37 = *(ulong *)((long)src + 8);
          *puVar23 = *src;
          puVar23[1] = uVar37;
          if (0x10 < uVar24) {
            pBVar27 = seqStore->lit;
            uVar37 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar27 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar27 + 0x18) = uVar37;
            if (0x20 < (long)uVar24) {
              lVar33 = 0;
              do {
                pBVar38 = (BYTE *)((long)src + lVar33 + 0x20);
                uVar16 = *(undefined8 *)(pBVar38 + 8);
                pBVar19 = pBVar27 + lVar33 + 0x20;
                *(undefined8 *)pBVar19 = *(undefined8 *)pBVar38;
                *(undefined8 *)(pBVar19 + 8) = uVar16;
                pBVar38 = (BYTE *)((long)src + lVar33 + 0x30);
                uVar16 = *(undefined8 *)(pBVar38 + 8);
                *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)pBVar38;
                *(undefined8 *)(pBVar19 + 0x18) = uVar16;
                lVar33 = lVar33 + 0x20;
              } while (pBVar19 + 0x20 < pBVar27 + uVar24);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar13 = seqStore->sequences;
        psVar13->litLength = (U16)uVar24;
        psVar13->offset = UVar20;
        if ((BYTE *)0xffff < pBVar36 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar13->matchLength = (U16)(pBVar36 + -3);
        seqStore->sequences = psVar13 + 1;
        puVar28 = (ulong *)((long)puVar28 + (long)pBVar36);
        src = puVar28;
        if (((int)uVar32 != 0) && (puVar28 <= iLimit)) {
          uVar24 = (ulong)local_124;
          while( true ) {
            uVar37 = uVar24;
            uVar24 = uVar32;
            uVar32 = uVar24;
            src = puVar28;
            local_124 = (uint)uVar37;
            if ((int)*puVar28 != *(int *)((long)puVar28 - uVar24)) break;
            puVar23 = (ulong *)((long)puVar28 + 4);
            puVar22 = (ulong *)((long)puVar28 + (4 - uVar24));
            puVar29 = puVar23;
            if (puVar23 < puVar1) {
              uVar18 = *puVar23 ^ *puVar22;
              uVar32 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              pBVar27 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
              if (*puVar22 == *puVar23) {
                puVar29 = (ulong *)((long)puVar28 + 0xc);
                puVar22 = (ulong *)((long)puVar28 + (0xc - uVar24));
                do {
                  if (puVar1 <= puVar29) goto LAB_006c69bc;
                  uVar32 = *puVar22;
                  uVar18 = *puVar29;
                  uVar39 = uVar18 ^ uVar32;
                  uVar31 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                    }
                  }
                  pBVar27 = (BYTE *)((long)puVar29 + ((uVar31 >> 3 & 0x1fffffff) - (long)puVar23));
                  puVar29 = puVar29 + 1;
                  puVar22 = puVar22 + 1;
                } while (uVar32 == uVar18);
              }
            }
            else {
LAB_006c69bc:
              if ((puVar29 < puVar2) && ((int)*puVar22 == (int)*puVar29)) {
                puVar29 = (ulong *)((long)puVar29 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar29 < puVar3) && ((short)*puVar22 == (short)*puVar29)) {
                puVar29 = (ulong *)((long)puVar29 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar29 < puVar5) {
                puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar29));
              }
              pBVar27 = (BYTE *)((long)puVar29 - (long)puVar23);
            }
            if (puVar28 <= puVar4) {
              puVar23 = (ulong *)seqStore->lit;
              uVar32 = puVar28[1];
              *puVar23 = *puVar28;
              puVar23[1] = uVar32;
            }
            psVar13 = seqStore->sequences;
            psVar13->litLength = 0;
            psVar13->offset = 1;
            if ((BYTE *)0xffff < pBVar27 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar13 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar13->matchLength = (U16)(pBVar27 + 1);
            seqStore->sequences = psVar13 + 1;
            puVar28 = (ulong *)((long)puVar28 + (long)(pBVar27 + 4));
            uVar32 = uVar37;
            src = puVar28;
            local_124 = (uint)uVar24;
            if (((uint)uVar37 == 0) || (iLimit < puVar28)) break;
          }
        }
      }
      uVar26 = (uint)uVar32;
    } while (puVar28 < iLimit);
  }
  uVar21 = 0;
  if (uVar41 < uVar34) {
    uVar21 = uVar34;
  }
  if (uVar41 < uVar10) {
    uVar21 = uVar10;
  }
  if (local_124 == 0) {
    local_124 = uVar21;
  }
  if (uVar26 != 0) {
    uVar21 = uVar26;
  }
  *rep = local_124;
  rep[1] = uVar21;
  return (long)puVar5 - (long)src;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
ZSTD_compressBlock_lazy_generic(
                        ZSTD_matchState_t* ms, seqStore_t* seqStore,
                        U32 rep[ZSTD_REP_NUM],
                        const void* src, size_t srcSize,
                        const searchMethod_e searchMethod, const U32 depth,
                        ZSTD_dictMode_e const dictMode)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = searchMethod == search_rowHash ? iend - 8 - ZSTD_ROW_HASH_CACHE_SIZE : iend - 8;
    const BYTE* const base = ms->window.base;
    const U32 prefixLowestIndex = ms->window.dictLimit;
    const BYTE* const prefixLowest = base + prefixLowestIndex;
    const U32 rowLog = ms->cParams.searchLog < 5 ? 4 : 5;

    typedef size_t (*searchMax_f)(
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* iLimit, size_t* offsetPtr);

    /**
     * This table is indexed first by the four ZSTD_dictMode_e values, and then
     * by the two searchMethod_e values. NULLs are placed for configurations
     * that should never occur (extDict modes go to the other implementation
     * below and there is no DDSS for binary tree search yet).
     */
    const searchMax_f searchFuncs[4][3] = {
        {
            ZSTD_HcFindBestMatch_selectMLS,
            ZSTD_BtFindBestMatch_selectMLS,
            ZSTD_RowFindBestMatch_selectRowLog
        },
        {
            NULL,
            NULL,
            NULL
        },
        {
            ZSTD_HcFindBestMatch_dictMatchState_selectMLS,
            ZSTD_BtFindBestMatch_dictMatchState_selectMLS,
            ZSTD_RowFindBestMatch_dictMatchState_selectRowLog
        },
        {
            ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS,
            NULL,
            ZSTD_RowFindBestMatch_dedicatedDictSearch_selectRowLog
        }
    };

    searchMax_f const searchMax = searchFuncs[dictMode][(int)searchMethod];
    U32 offset_1 = rep[0], offset_2 = rep[1], savedOffset=0;

    const int isDMS = dictMode == ZSTD_dictMatchState;
    const int isDDS = dictMode == ZSTD_dedicatedDictSearch;
    const int isDxS = isDMS || isDDS;
    const ZSTD_matchState_t* const dms = ms->dictMatchState;
    const U32 dictLowestIndex      = isDxS ? dms->window.dictLimit : 0;
    const BYTE* const dictBase     = isDxS ? dms->window.base : NULL;
    const BYTE* const dictLowest   = isDxS ? dictBase + dictLowestIndex : NULL;
    const BYTE* const dictEnd      = isDxS ? dms->window.nextSrc : NULL;
    const U32 dictIndexDelta       = isDxS ?
                                     prefixLowestIndex - (U32)(dictEnd - dictBase) :
                                     0;
    const U32 dictAndPrefixLength = (U32)((ip - prefixLowest) + (dictEnd - dictLowest));

    assert(searchMax != NULL);

    DEBUGLOG(5, "ZSTD_compressBlock_lazy_generic (dictMode=%u) (searchFunc=%u)", (U32)dictMode, (U32)searchMethod);
    ip += (dictAndPrefixLength == 0);
    if (dictMode == ZSTD_noDict) {
        U32 const curr = (U32)(ip - base);
        U32 const windowLow = ZSTD_getLowestPrefixIndex(ms, curr, ms->cParams.windowLog);
        U32 const maxRep = curr - windowLow;
        if (offset_2 > maxRep) savedOffset = offset_2, offset_2 = 0;
        if (offset_1 > maxRep) savedOffset = offset_1, offset_1 = 0;
    }
    if (isDxS) {
        /* dictMatchState repCode checks don't currently handle repCode == 0
         * disabling. */
        assert(offset_1 <= dictAndPrefixLength);
        assert(offset_2 <= dictAndPrefixLength);
    }

    if (searchMethod == search_rowHash) {
        ZSTD_row_fillHashCache(ms, base, rowLog,
                            MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */),
                            ms->nextToUpdate, ilimit);
    }

    /* Match Loop */
#if defined(__GNUC__) && defined(__x86_64__)
    /* I've measured random a 5% speed loss on levels 5 & 6 (greedy) when the
     * code alignment is perturbed. To fix the instability align the loop on 32-bytes.
     */
    __asm__(".p2align 5");
#endif
    while (ip < ilimit) {
        size_t matchLength=0;
        size_t offset=0;
        const BYTE* start=ip+1;

        /* check repCode */
        if (isDxS) {
            const U32 repIndex = (U32)(ip - base) + 1 - offset_1;
            const BYTE* repMatch = ((dictMode == ZSTD_dictMatchState || dictMode == ZSTD_dedicatedDictSearch)
                                && repIndex < prefixLowestIndex) ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
            if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
                const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                if (depth==0) goto _storeSequence;
            }
        }
        if ( dictMode == ZSTD_noDict
          && ((offset_1 > 0) & (MEM_read32(ip+1-offset_1) == MEM_read32(ip+1)))) {
            matchLength = ZSTD_count(ip+1+4, ip+1+4-offset_1, iend) + 4;
            if (depth==0) goto _storeSequence;
        }

        /* first search (depth 0) */
        {   size_t offsetFound = 999999999;
            size_t const ml2 = searchMax(ms, ip, iend, &offsetFound);
            if (ml2 > matchLength)
                matchLength = ml2, start = ip, offset=offsetFound;
        }

        if (matchLength < 4) {
            ip += ((ip-anchor) >> kSearchStrength) + 1;   /* jump faster over incompressible sections */
            continue;
        }

        /* let's try to find a better solution */
        if (depth>=1)
        while (ip<ilimit) {
            ip ++;
            if ( (dictMode == ZSTD_noDict)
              && (offset) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                int const gain2 = (int)(mlRep * 3);
                int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offset+1) + 1);
                if ((mlRep >= 4) && (gain2 > gain1))
                    matchLength = mlRep, offset = 0, start = ip;
            }
            if (isDxS) {
                const U32 repIndex = (U32)(ip - base) - offset_1;
                const BYTE* repMatch = repIndex < prefixLowestIndex ?
                               dictBase + (repIndex - dictIndexDelta) :
                               base + repIndex;
                if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                    && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                    size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                    int const gain2 = (int)(mlRep * 3);
                    int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offset+1) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offset = 0, start = ip;
                }
            }
            {   size_t offset2=999999999;
                size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 4);
                if ((ml2 >= 4) && (gain2 > gain1)) {
                    matchLength = ml2, offset = offset2, start = ip;
                    continue;   /* search a better one */
            }   }

            /* let's find an even better one */
            if ((depth==2) && (ip<ilimit)) {
                ip ++;
                if ( (dictMode == ZSTD_noDict)
                  && (offset) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                    size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                    int const gain2 = (int)(mlRep * 4);
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offset = 0, start = ip;
                }
                if (isDxS) {
                    const U32 repIndex = (U32)(ip - base) - offset_1;
                    const BYTE* repMatch = repIndex < prefixLowestIndex ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
                    if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                        && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                        const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                        size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                        int const gain2 = (int)(mlRep * 4);
                        int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 1);
                        if ((mlRep >= 4) && (gain2 > gain1))
                            matchLength = mlRep, offset = 0, start = ip;
                    }
                }
                {   size_t offset2=999999999;
                    size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                    int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 7);
                    if ((ml2 >= 4) && (gain2 > gain1)) {
                        matchLength = ml2, offset = offset2, start = ip;
                        continue;
            }   }   }
            break;  /* nothing found : store previous solution */
        }

        /* NOTE:
         * start[-offset+ZSTD_REP_MOVE-1] is undefined behavior.
         * (-offset+ZSTD_REP_MOVE-1) is unsigned, and is added to start, which
         * overflows the pointer, which is undefined behavior.
         */
        /* catch up */
        if (offset) {
            if (dictMode == ZSTD_noDict) {
                while ( ((start > anchor) & (start - (offset-ZSTD_REP_MOVE) > prefixLowest))
                     && (start[-1] == (start-(offset-ZSTD_REP_MOVE))[-1]) )  /* only search for offset within prefix */
                    { start--; matchLength++; }
            }
            if (isDxS) {
                U32 const matchIndex = (U32)((start-base) - (offset - ZSTD_REP_MOVE));
                const BYTE* match = (matchIndex < prefixLowestIndex) ? dictBase + matchIndex - dictIndexDelta : base + matchIndex;
                const BYTE* const mStart = (matchIndex < prefixLowestIndex) ? dictLowest : prefixLowest;
                while ((start>anchor) && (match>mStart) && (start[-1] == match[-1])) { start--; match--; matchLength++; }  /* catch up */
            }
            offset_2 = offset_1; offset_1 = (U32)(offset - ZSTD_REP_MOVE);
        }
        /* store sequence */
_storeSequence:
        {   size_t const litLength = start - anchor;
            ZSTD_storeSeq(seqStore, litLength, anchor, iend, (U32)offset, matchLength-MINMATCH);
            anchor = ip = start + matchLength;
        }

        /* check immediate repcode */
        if (isDxS) {
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex = current2 - offset_2;
                const BYTE* repMatch = repIndex < prefixLowestIndex ?
                        dictBase - dictIndexDelta + repIndex :
                        base + repIndex;
                if ( ((U32)((prefixLowestIndex-1) - (U32)repIndex) >= 3 /* intentional overflow */)
                   && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex < prefixLowestIndex ? dictEnd : iend;
                    matchLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd2, prefixLowest) + 4;
                    offset = offset_2; offset_2 = offset_1; offset_1 = (U32)offset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, matchLength-MINMATCH);
                    ip += matchLength;
                    anchor = ip;
                    continue;
                }
                break;
            }
        }

        if (dictMode == ZSTD_noDict) {
            while ( ((ip <= ilimit) & (offset_2>0))
                 && (MEM_read32(ip) == MEM_read32(ip - offset_2)) ) {
                /* store sequence */
                matchLength = ZSTD_count(ip+4, ip+4-offset_2, iend) + 4;
                offset = offset_2; offset_2 = offset_1; offset_1 = (U32)offset; /* swap repcodes */
                ZSTD_storeSeq(seqStore, 0, anchor, iend, 0, matchLength-MINMATCH);
                ip += matchLength;
                anchor = ip;
                continue;   /* faster when present ... (?) */
    }   }   }

    /* Save reps for next block */
    rep[0] = offset_1 ? offset_1 : savedOffset;
    rep[1] = offset_2 ? offset_2 : savedOffset;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}